

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcsample.c
# Opt level: O0

void fullsize_smooth_downsample
               (j_compress_ptr cinfo,jpeg_component_info *compptr,JSAMPARRAY input_data,
               JSAMPARRAY output_data)

{
  byte *pbVar1;
  byte *pbVar2;
  byte *pbVar3;
  JDIMENSION output_cols_00;
  int iVar4;
  long lVar5;
  long lVar6;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int nextcolsum;
  int lastcolsum;
  int colsum;
  JLONG neighscale;
  JLONG memberscale;
  JLONG neighsum;
  JLONG membersum;
  JSAMPROW outptr;
  JSAMPROW below_ptr;
  JSAMPROW above_ptr;
  JSAMPROW inptr;
  JDIMENSION output_cols;
  JDIMENSION colctr;
  int outrow;
  int local_78;
  int local_74;
  undefined1 *local_50;
  byte *local_48;
  byte *local_40;
  byte *local_38;
  int local_28;
  int local_24;
  
  output_cols_00 = *(int *)(in_RSI + 0x1c) * 8;
  expand_right_edge((JSAMPARRAY)(in_RDX + -8),*(int *)(in_RDI + 0x13c) + 2,
                    *(JDIMENSION *)(in_RDI + 0x30),output_cols_00);
  lVar5 = (long)*(int *)(in_RDI + 0x110) * -0x200 + 0x10000;
  lVar6 = (long)(*(int *)(in_RDI + 0x110) << 6);
  for (local_24 = 0; local_24 < *(int *)(in_RSI + 0xc); local_24 = local_24 + 1) {
    local_50 = *(undefined1 **)(in_RCX + (long)local_24 * 8);
    pbVar1 = *(byte **)(in_RDX + (long)local_24 * 8);
    pbVar2 = *(byte **)(in_RDX + (long)(local_24 + -1) * 8);
    pbVar3 = *(byte **)(in_RDX + (long)(local_24 + 1) * 8);
    local_40 = pbVar2 + 1;
    local_48 = pbVar3 + 1;
    local_78 = (uint)*pbVar2 + (uint)*pbVar3 + (uint)*pbVar1;
    local_74 = (uint)*local_40 + (uint)*local_48 + (uint)pbVar1[1];
    *local_50 = (char)((ulong)*pbVar1 * lVar5 +
                       ((long)local_78 + ((long)local_78 - (ulong)*pbVar1) + (long)local_74) * lVar6
                       + 0x8000 >> 0x10);
    local_38 = pbVar1 + 1;
    for (local_28 = output_cols_00 - 2; local_50 = local_50 + 1, local_28 != 0;
        local_28 = local_28 + -1) {
      local_40 = local_40 + 1;
      local_48 = local_48 + 1;
      iVar4 = (uint)*local_40 + (uint)*local_48 + (uint)local_38[1];
      *local_50 = (char)((ulong)*local_38 * lVar5 +
                         ((long)local_78 + ((long)local_74 - (ulong)*local_38) + (long)iVar4) *
                         lVar6 + 0x8000 >> 0x10);
      local_78 = local_74;
      local_74 = iVar4;
      local_38 = local_38 + 1;
    }
    *local_50 = (char)((ulong)*local_38 * lVar5 +
                       ((long)local_78 + ((long)local_74 - (ulong)*local_38) + (long)local_74) *
                       lVar6 + 0x8000 >> 0x10);
  }
  return;
}

Assistant:

METHODDEF(void)
fullsize_smooth_downsample(j_compress_ptr cinfo, jpeg_component_info *compptr,
                           JSAMPARRAY input_data, JSAMPARRAY output_data)
{
  int outrow;
  JDIMENSION colctr;
  JDIMENSION output_cols = compptr->width_in_blocks * DCTSIZE;
  register JSAMPROW inptr, above_ptr, below_ptr, outptr;
  JLONG membersum, neighsum, memberscale, neighscale;
  int colsum, lastcolsum, nextcolsum;

  /* Expand input data enough to let all the output samples be generated
   * by the standard loop.  Special-casing padded output would be more
   * efficient.
   */
  expand_right_edge(input_data - 1, cinfo->max_v_samp_factor + 2,
                    cinfo->image_width, output_cols);

  /* Each of the eight neighbor pixels contributes a fraction SF to the
   * smoothed pixel, while the main pixel contributes (1-8*SF).  In order
   * to use integer arithmetic, these factors are multiplied by 2^16 = 65536.
   * Also recall that SF = smoothing_factor / 1024.
   */

  memberscale = 65536L - cinfo->smoothing_factor * 512L; /* scaled 1-8*SF */
  neighscale = cinfo->smoothing_factor * 64; /* scaled SF */

  for (outrow = 0; outrow < compptr->v_samp_factor; outrow++) {
    outptr = output_data[outrow];
    inptr = input_data[outrow];
    above_ptr = input_data[outrow - 1];
    below_ptr = input_data[outrow + 1];

    /* Special case for first column */
    colsum = (*above_ptr++) + (*below_ptr++) + inptr[0];
    membersum = *inptr++;
    nextcolsum = above_ptr[0] + below_ptr[0] + inptr[0];
    neighsum = colsum + (colsum - membersum) + nextcolsum;
    membersum = membersum * memberscale + neighsum * neighscale;
    *outptr++ = (JSAMPLE)((membersum + 32768) >> 16);
    lastcolsum = colsum;  colsum = nextcolsum;

    for (colctr = output_cols - 2; colctr > 0; colctr--) {
      membersum = *inptr++;
      above_ptr++;  below_ptr++;
      nextcolsum = above_ptr[0] + below_ptr[0] + inptr[0];
      neighsum = lastcolsum + (colsum - membersum) + nextcolsum;
      membersum = membersum * memberscale + neighsum * neighscale;
      *outptr++ = (JSAMPLE)((membersum + 32768) >> 16);
      lastcolsum = colsum;  colsum = nextcolsum;
    }

    /* Special case for last column */
    membersum = *inptr;
    neighsum = lastcolsum + (colsum - membersum) + colsum;
    membersum = membersum * memberscale + neighsum * neighscale;
    *outptr = (JSAMPLE)((membersum + 32768) >> 16);

  }
}